

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void diy::Serialization<diy::MemoryBuffer>::load(BinaryBuffer *bb,MemoryBuffer *x)

{
  (*bb->_vptr_BinaryBuffer[4])(bb,&x->position,8);
  std::vector<char,_std::allocator<char>_>::resize(&x->buffer,x->position);
  if (x->position != 0) {
    (*bb->_vptr_BinaryBuffer[4])
              (bb,(x->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start);
    return;
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, MemoryBuffer& x)
    {
      diy::load(bb, x.position);
      x.buffer.resize(x.position);
      if (x.position > 0)
          diy::load(bb, &x.buffer[0], x.position);
    }